

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_null_callback(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t handle;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&handle);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = -0x16;
    iVar1 = uv_timer_start(&handle,0,100);
    eval_b = (int64_t)iVar1;
    if (eval_b == -0x16) {
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      eval_a = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      eval_b = (int64_t)iVar1;
      if (eval_b == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar4 = "uv_loop_close(uv_default_loop())";
      pcVar3 = "0";
      uVar2 = 0x173;
    }
    else {
      pcVar4 = "uv_timer_start(&handle, ((void*)0), 100, 100)";
      pcVar3 = "UV_EINVAL";
      uVar2 = 0x171;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_timer_init(uv_default_loop(), &handle)";
    uVar2 = 0x170;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(timer_null_callback) {
  uv_timer_t handle;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &handle));
  ASSERT_EQ(UV_EINVAL, uv_timer_start(&handle, NULL, 100, 100));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}